

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  float fVar1;
  double *outSumLogLikelihood_00;
  float *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  int k_1;
  float wtl;
  int l;
  int k;
  float wt0;
  int v;
  int u;
  float *wt;
  float *rootPartials;
  int local_4c;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  
  outSumLogLikelihood_00 = *(double **)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
  pfVar2 = *(float **)(*(long *)(in_RDI + 0x98) + (long)in_EDX * 8);
  local_38 = 0;
  fVar1 = *pfVar2;
  for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x14); local_40 = local_40 + 1) {
    *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_38 * 4) =
         *(float *)((long)outSumLogLikelihood_00 + (long)local_38 * 4) * fVar1;
    *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_38 + 1) * 4) =
         *(float *)((long)outSumLogLikelihood_00 + (long)(local_38 + 1) * 4) * fVar1;
    *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_38 + 2) * 4) =
         *(float *)((long)outSumLogLikelihood_00 + (long)(local_38 + 2) * 4) * fVar1;
    *(float *)(*(long *)(in_RDI + 0xd8) + (long)(local_38 + 3) * 4) =
         *(float *)((long)outSumLogLikelihood_00 + (long)(local_38 + 3) * 4) * fVar1;
    local_38 = local_38 + 4;
  }
  for (local_44 = 1; local_44 < *(int *)(in_RDI + 0x34); local_44 = local_44 + 1) {
    local_34 = 0;
    fVar1 = pfVar2[local_44];
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x14); local_4c = local_4c + 1) {
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                               ZEXT416(*(uint *)((long)outSumLogLikelihood_00 + (long)local_38 * 4))
                               ,ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_34 * 4)));
      *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_34 * 4) = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                               ZEXT416(*(uint *)((long)outSumLogLikelihood_00 +
                                                (long)(local_38 + 1) * 4)),
                               ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 1) * 4
                                                )));
      *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 1) * 4) = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                               ZEXT416(*(uint *)((long)outSumLogLikelihood_00 +
                                                (long)(local_38 + 2) * 4)),
                               ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 2) * 4
                                                )));
      *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 2) * 4) = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                               ZEXT416(*(uint *)((long)outSumLogLikelihood_00 +
                                                (long)(local_38 + 3) * 4)),
                               ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 3) * 4
                                                )));
      *(int *)(*(long *)(in_RDI + 0xd8) + (long)(local_34 + 3) * 4) = auVar3._0_4_;
      local_34 = local_34 + 4;
      local_38 = local_38 + 4;
    }
    local_38 = *(int *)(in_RDI + 0x1c) * 4 + local_38;
  }
  iVar4 = integrateOutStatesAndScale
                    ((BeagleCPU4StateImpl<float,_1,_0> *)CONCAT44(in_ESI,in_EDX),
                     (float *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                     outSumLogLikelihood_00);
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}